

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.hpp
# Opt level: O3

void __thiscall
ableton::platforms::asio::Socket<512ul>::
receive<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&,512ul>::SocketReceiver<ableton::discovery::UnicastTag,ableton::util::SafeAsyncHandler<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&,512ul>,ableton::link::PeerState,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&>::Impl>>>
          (Socket<512ul> *this,
          SocketReceiver<ableton::discovery::UnicastTag,_ableton::util::SafeAsyncHandler<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>::Impl>_>
          *handler)

{
  _Atomic_word *p_Var1;
  int iVar2;
  SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl> local_28;
  mutable_buffers_1 local_18;
  
  std::
  function<void(asio::ip::basic_endpoint<asio::ip::udp>const&,unsigned_char_const*,unsigned_char_const*)>
  ::operator=((function<void(asio::ip::basic_endpoint<asio::ip::udp>const&,unsigned_char_const*,unsigned_char_const*)>
               *)(*(long *)this + 0x240),handler);
  local_28.mpDelegate.
  super___weak_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = *(element_type **)this;
  local_18.super_mutable_buffer.data_ =
       &(local_28.mpDelegate.
         super___weak_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->mReceiveBuffer;
  local_18.super_mutable_buffer.size_ = 0x200;
  local_28.mpDelegate.
  super___weak_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  if (local_28.mpDelegate.
      super___weak_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.mpDelegate.
       super___weak_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count =
           (local_28.mpDelegate.
            super___weak_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_28.mpDelegate.
       super___weak_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count =
           (local_28.mpDelegate.
            super___weak_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_weak_count + 1;
    }
  }
  ::asio::detail::reactive_socket_service<asio::ip::udp>::
  async_receive_from<asio::mutable_buffers_1,ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512ul>::Impl>>
            (&(((local_28.mpDelegate.
                 super___weak_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->mSocket).
               super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>.
               super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.service_)->
              service_impl_,
             &((local_28.mpDelegate.
                super___weak_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->mSocket).
              super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>.
              super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.
              implementation_,&local_18,
             &(local_28.mpDelegate.
               super___weak_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->mSenderEndpoint,0,&local_28);
  if (local_28.mpDelegate.
      super___weak_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_28.mpDelegate.
                 super___weak_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_28.mpDelegate.
               super___weak_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi)->_M_weak_count;
      (local_28.mpDelegate.
       super___weak_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_28.mpDelegate.
         super___weak_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

void receive(Handler handler)
  {
    mpImpl->mHandler = std::move(handler);
    mpImpl->mSocket.async_receive_from(
      ::asio::buffer(mpImpl->mReceiveBuffer, MaxPacketSize), mpImpl->mSenderEndpoint,
      util::makeAsyncSafe(mpImpl));
  }